

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2_variable_reference.cpp
# Opt level: O2

string * mod_string_by_creating_temp(string *__return_storage_ptr__,string *s1,string *s2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::operator+(&local_50,s2,s1);
  std::operator+(&local_30,&local_50,s2);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string mod_string_by_creating_temp(const std::string & s1, const std::string & s2) {
    std::string temp;
    temp = s2 + s1 + s2;
    //  返回一份 string 的复制
    return temp;
}